

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O2

void __thiscall NoiseSource::proceedToNextState(NoiseSource *this)

{
  int n;
  ulong uVar1;
  int i;
  long lVar2;
  double omega;
  double dVar3;
  
  (this->super_StochasticProcess).stochNextStateIsPrepared = false;
  for (lVar2 = 0; lVar2 < this->nNoises; lVar2 = lVar2 + 1) {
    if (this->aNoises[lVar2] != (Noise *)0x0) {
      dVar3 = 0.0;
      for (uVar1 = 0; (uint)this->nNoises != uVar1; uVar1 = uVar1 + 1) {
        dVar3 = dVar3 + this->aA[lVar2][uVar1] * this->aOmega[uVar1];
      }
      (*(this->aNoises[lVar2]->super_StochasticVariable).super_StochasticProcess.super_Parametric.
        _vptr_Parametric[0xf])(dVar3);
    }
  }
  (this->super_StochasticProcess).stochNextStateIsPrepared = false;
  return;
}

Assistant:

void NoiseSource::proceedToNextState()
{
	stochNextStateIsPrepared = false;
	for(int i=0; i<nNoises; ++i) {
		if(aNoises[i]) {
			double omega = 0.0;
			
			// sum up next value
			for(int n=0; n<nNoises; ++n)
				omega += aA[i][n] * aOmega[n];
			
			// notify noise process
			aNoises[i]->setNext(omega);
		}
	}
	stochNextStateIsPrepared = false;
}